

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetMaxColumnWidth(ImGuiTable *table,int column_n)

{
  float fVar1;
  float fVar2;
  ImGuiTableColumn *pIVar3;
  float fVar4;
  
  pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  fVar1 = table->CellPaddingX;
  fVar2 = table->CellSpacingX2;
  fVar4 = table->MinColumnWidth + fVar1 + fVar1 + table->CellSpacingX1 + fVar2;
  if (((uint)table->Flags >> 0x18 & 1) == 0) {
    if (((uint)table->Flags >> 0x12 & 1) == 0) {
      return (((((table->WorkRect).Max.x -
                (float)(~(int)pIVar3->IndexWithinEnabledSet + (int)table->ColumnsEnabledCount) *
                fVar4) - pIVar3->MinX) - fVar2) - (fVar1 + fVar1)) - table->OuterPaddingX;
    }
  }
  else if (pIVar3->DisplayOrder < table->FreezeColumnsRequest) {
    return (((((table->InnerClipRect).Max.x -
              (float)((int)table->FreezeColumnsRequest - (int)pIVar3->DisplayOrder) * fVar4) -
             pIVar3->MinX) - table->OuterPaddingX) - fVar1) - fVar2;
  }
  return 3.4028235e+38;
}

Assistant:

float ImGui::TableGetMaxColumnWidth(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float max_width = FLT_MAX;
    const float min_column_distance = table->MinColumnWidth + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        // Frozen columns can't reach beyond visible width else scrolling will naturally break.
        if (column->DisplayOrder < table->FreezeColumnsRequest)
        {
            max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - column->DisplayOrder) * min_column_distance) - column->MinX;
            max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
        }
    }
    else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
    {
        // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
        // sure they are all visible. Because of this we also know that all of the columns will always fit in
        // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
        // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
        // See "table_width_distrib" and "table_width_keep_visible" tests
        max_width = table->WorkRect.Max.x - (table->ColumnsEnabledCount - column->IndexWithinEnabledSet - 1) * min_column_distance - column->MinX;
        //max_width -= table->CellSpacingX1;
        max_width -= table->CellSpacingX2;
        max_width -= table->CellPaddingX * 2.0f;
        max_width -= table->OuterPaddingX;
    }
    return max_width;
}